

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

bool __thiscall AActor::CheckLocalView(AActor *this,int playernum)

{
  long lVar1;
  AActor *pAVar2;
  
  lVar1 = (long)playernum;
  pAVar2 = (AActor *)(&DAT_017e1fb8)[lVar1 * 0x54];
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if (pAVar2 == this) {
        return true;
      }
      goto LAB_0042010d;
    }
    (&DAT_017e1fb8)[lVar1 * 0x54] = 0;
  }
  pAVar2 = (AActor *)0x0;
LAB_0042010d:
  if (pAVar2 != (AActor *)0x0 && (AActor *)(&players)[lVar1 * 0x54] == this) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((pAVar2->player == (player_t *)0x0) && (((pAVar2->flags3).Value & 0x2000) == 0)) {
        return true;
      }
    }
    else {
      (&DAT_017e1fb8)[lVar1 * 0x54] = 0;
    }
  }
  return false;
}

Assistant:

bool AActor::CheckLocalView (int playernum) const
{
	if (players[playernum].camera == this)
	{
		return true;
	}
	if (players[playernum].mo != this || players[playernum].camera == NULL)
	{
		return false;
	}
	if (players[playernum].camera->player == NULL &&
		!(players[playernum].camera->flags3 & MF3_ISMONSTER))
	{
		return true;
	}
	return false;
}